

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  huffman_tree_node *phVar1;
  huffman_tree_node *phVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *fmt;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  code->numentries = 0;
  code->numallocatedentries = 0;
  iVar3 = new_node(code);
  if (iVar3 < 0) {
    fmt = "Unable to allocate memory for node data.";
    iVar3 = 0xc;
LAB_004a7927:
    archive_set_error(&a->archive,iVar3,fmt);
    iVar3 = -0x1e;
  }
  else {
    code->numentries = 1;
    code->minlength = 0x7fffffff;
    code->maxlength = -0x80000000;
    uVar5 = 0;
    if (0 < numsymbols) {
      uVar5 = (ulong)(uint)numsymbols;
    }
    uVar8 = 0;
    for (uVar7 = 1; uVar7 != 0x10; uVar7 = uVar7 + 1) {
      for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
        if (uVar7 == lengths[uVar9]) {
          free(code->table);
          code->table = (huffman_table_entry *)0x0;
          if (code->maxlength < (int)uVar7) {
            code->maxlength = uVar7;
          }
          if ((int)uVar7 < code->minlength) {
            code->minlength = uVar7;
          }
          iVar3 = 0;
          uVar6 = uVar7;
          while( true ) {
            iVar4 = iVar3;
            phVar2 = code->tree;
            phVar1 = phVar2 + iVar4;
            if ((int)uVar6 < 1) break;
            if (phVar1->branches[0] == phVar1->branches[1]) goto LAB_004a78ff;
            uVar6 = uVar6 - 1;
            bVar10 = (uVar8 >> (uVar6 & 0x1f) & 1) != 0;
            iVar3 = phVar1->branches[bVar10];
            if (phVar1->branches[bVar10] < 0) {
              iVar3 = new_node(code);
              if (iVar3 < 0) {
                fmt = "Unable to allocate memory for node data.";
                iVar3 = 0xc;
                goto LAB_004a7927;
              }
              iVar3 = code->numentries;
              code->numentries = iVar3 + 1;
              code->tree[iVar4].branches[bVar10] = iVar3;
            }
          }
          if ((phVar1->branches[0] != -1) || (phVar1->branches[1] != -2)) {
LAB_004a78ff:
            fmt = "Prefix found";
            iVar3 = 0x54;
            goto LAB_004a7927;
          }
          phVar2[iVar4].branches[0] = (int)uVar9;
          phVar2[iVar4].branches[1] = (int)uVar9;
          uVar8 = uVar8 + 1;
          iVar3 = numsymbols + -1;
          bVar10 = numsymbols < 2;
          numsymbols = iVar3;
          if (bVar10) break;
        }
      }
      uVar8 = uVar8 * 2;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  code->numentries = 0;
  code->numallocatedentries = 0;
  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0) { break; break; }
    }
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}